

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfPub.c
# Opt level: O0

void sbfPub_sendBuffer(sbfPub pub,sbfBuffer buffer)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  undefined2 *puVar4;
  sbfBuffer in_RSI;
  sbfPub in_RDI;
  sbfTportStream unaff_retaddr;
  size_t size;
  sbfTportHeader hdr;
  sbfTportStream tstream;
  sbfTport tport;
  sbfBuffer in_stack_ffffffffffffffa8;
  sbfTportStream in_stack_ffffffffffffffb0;
  sbfPub buffer_00;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  byte bVar5;
  sbfTportImpl *hdrSize;
  
  hdrSize = in_RDI->mTport;
  if ((in_RSI->mRefCount).mRefCount == 1) {
    buffer_00 = in_RDI;
    sbfBuffer_getSize(in_RSI);
    iVar1 = sbfTport_checkMessageSize
                      (in_RDI,CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    if (iVar1 == 0) {
      sbfBuffer_destroy((sbfBuffer)0x105be6);
    }
    else {
      bVar5 = 1;
      if (buffer_00->mDestroyed == 0) {
        bVar5 = buffer_00->mReady != 0 ^ 0xff;
      }
      if ((bVar5 & 1) == 0) {
        sVar2 = sbfBuffer_getSize(in_RSI);
        if ((ulong)hdrSize->mHandlerTable->mPacketSize < sVar2 + buffer_00->mHeaderSize) {
          sbfTport_fragment(unaff_retaddr,(sbfBuffer)buffer_00,(sbfTportHeader)in_RSI,
                            (size_t)hdrSize);
          sbfBuffer_destroy((sbfBuffer)0x105ca6);
        }
        else if ((sbfPub)in_RSI->mOwner == buffer_00) {
          pvVar3 = sbfBuffer_getData(in_RSI);
          puVar4 = (undefined2 *)((long)pvVar3 - buffer_00->mHeaderSize);
          sVar2 = sbfBuffer_getSize(in_RSI);
          *puVar4 = (short)sVar2;
          *(undefined1 *)(puVar4 + 2) = 1;
          sbfBuffer_setData((sbfBuffer)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          sbfBuffer_setSize((sbfBuffer)in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
          sbfTport_sendBuffer(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          sbfBuffer_destroy((sbfBuffer)0x105d83);
        }
        else {
          pvVar3 = sbfBuffer_getData(in_RSI);
          sbfBuffer_getSize(in_RSI);
          sbfPub_send((sbfPub)CONCAT17(bVar5,in_stack_ffffffffffffffc0),pvVar3,(size_t)buffer_00);
          sbfBuffer_destroy((sbfBuffer)0x105d0c);
        }
      }
      else {
        sbfBuffer_destroy((sbfBuffer)0x105c2d);
      }
    }
    return;
  }
  __assert_fail("((&buffer->mRefCount)->mRefCount) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/blu-corner[P]sbf/src/transport/sbfPub.c"
                ,0x166,"void sbfPub_sendBuffer(sbfPub, sbfBuffer)");
}

Assistant:

void
sbfPub_sendBuffer (sbfPub pub, sbfBuffer buffer)
{
    sbfTport       tport = pub->mTport;
    sbfTportStream tstream = pub->mTportStream;
    sbfTportHeader hdr;
    size_t         size;

    SBF_ASSERT (sbfRefCount_get (&buffer->mRefCount) == 1);

    if (!sbfTport_checkMessageSize (pub, sbfBuffer_getSize (buffer)))
    {
        sbfBuffer_destroy (buffer);
        return;
    }
    if (SBF_UNLIKELY (pub->mDestroyed || !pub->mReady))
    {
        sbfBuffer_destroy (buffer);
        return;
    }

    size = sbfBuffer_getSize (buffer) + pub->mHeaderSize;
    if (SBF_UNLIKELY (size > tport->mHandlerTable->mPacketSize))
    {
        sbfTport_fragment (tstream, buffer, pub->mHeader, pub->mHeaderSize);
        sbfBuffer_destroy (buffer);
        return;
    }

    if (SBF_UNLIKELY (buffer->mOwner != pub))
    {
        sbfPub_send (pub,
                     sbfBuffer_getData (buffer),
                     sbfBuffer_getSize (buffer));
        sbfBuffer_destroy (buffer);
        return;
    }

    hdr = (void*)((char*)sbfBuffer_getData (buffer) - pub->mHeaderSize);
    hdr->mSize = sbfBuffer_getSize (buffer);
    hdr->mFlags = SBF_MESSAGE_FLAG_LAST_IN_PACKET;

    sbfBuffer_setData (buffer, hdr);
    sbfBuffer_setSize (buffer, size);

    sbfTport_sendBuffer (tstream, buffer);
    sbfBuffer_destroy (buffer);
}